

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::CodeGeneratorResponse::ByteSizeLong(CodeGeneratorResponse *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  reference value;
  uint32_t *puVar4;
  string *value_00;
  size_t sVar5;
  uint64_t value_01;
  CodeGeneratorResponse_File *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  CodeGeneratorResponse *this_local;
  
  iVar3 = _internal_file_size(this);
  sStack_18 = (size_t)iVar3;
  __end2 = RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::begin
                     (&this->file_);
  msg = (CodeGeneratorResponse_File *)
        RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::end(&this->file_);
  while (bVar2 = internal::
                 RepeatedPtrIterator<const_google::protobuf::compiler::CodeGeneratorResponse_File>::
                 operator!=(&__end2,(iterator *)&msg), bVar2) {
    value = internal::
            RepeatedPtrIterator<const_google::protobuf::compiler::CodeGeneratorResponse_File>::
            operator*(&__end2);
    sVar5 = internal::WireFormatLite::
            MessageSize<google::protobuf::compiler::CodeGeneratorResponse_File>(value);
    sStack_18 = sVar5 + sStack_18;
    internal::RepeatedPtrIterator<const_google::protobuf::compiler::CodeGeneratorResponse_File>::
    operator++(&__end2);
  }
  puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      value_00 = _internal_error_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(value_00);
      sStack_18 = sVar5 + 1 + sStack_18;
    }
    if ((uVar1 & 2) != 0) {
      value_01 = _internal_supported_features(this);
      sVar5 = internal::WireFormatLite::UInt64SizePlusOne(value_01);
      sStack_18 = sVar5 + sStack_18;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_18,&this->_cached_size_);
  return sVar5;
}

Assistant:

size_t CodeGeneratorResponse::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorResponse)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  total_size += 1UL * this->_internal_file_size();
  for (const auto& msg : this->file_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string error = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_error());
    }

    // optional uint64 supported_features = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_supported_features());
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}